

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  byte bVar1;
  Arena *pAVar2;
  char cVar3;
  int iVar4;
  LogMessage *other;
  Type *pTVar5;
  void *pvVar6;
  string *this_00;
  int index;
  LogMessage local_60;
  LogFinisher local_21;
  
  bVar1 = this->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    other = LogMessage::operator<<
                      (&local_60,
                       "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
    if (this->is_repeated == true) {
      this_00 = (this->field_0).string_value;
      if (0 < (int)this_00->_M_string_length) {
        index = 0;
        do {
          pTVar5 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)this_00,index);
          iVar4 = (*pTVar5->_vptr_MessageLite[6])(pTVar5);
          if ((char)iVar4 == '\0') {
            return false;
          }
          index = index + 1;
          this_00 = (this->field_0).string_value;
        } while (index < (int)this_00->_M_string_length);
      }
    }
    else if ((this->field_0xa & 1) == 0) {
      pAVar2 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar3 = (*(code *)(pAVar2->impl_).options_.max_block_size)();
      }
      else {
        pvVar6 = (*(pAVar2->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar3 = (char)pvVar6;
      }
      if (cVar3 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}